

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_isCompatibleBaseUnitImported_Test::TestBody(Units_isCompatibleBaseUnitImported_Test *this)

{
  string *psVar1;
  char cVar2;
  byte bVar3;
  AssertionResult gtest_ar_;
  ImportSourcePtr import;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr u;
  ModelPtr model;
  AssertionResult local_b8;
  long local_a8 [2];
  long *local_98;
  AssertHelper local_90 [8];
  byte local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68 [2];
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Model::create();
  psVar1 = local_28;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  psVar1 = local_38;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"apples","");
  local_78 = (string *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  libcellml::Units::addUnit(psVar1,(int)&local_b8,1.0,1.0,(string *)0x0);
  if (local_78 != (string *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_48;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  libcellml::Units::addUnit((StandardUnit)local_48,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_58;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  psVar1 = local_58;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u","");
  local_78 = (string *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  libcellml::Units::addUnit(local_58,(int)&local_b8,1.0,1.0,(string *)0x0);
  if (local_78 != (string *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_28);
  libcellml::Model::addUnits((shared_ptr *)local_28);
  libcellml::Model::addUnits((shared_ptr *)local_28);
  libcellml::ImportSource::create();
  psVar1 = local_78;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_38 + 0x10));
  local_88[0] = libcellml::ImportedEntity::isImport();
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88[0] == 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_88,"u->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75a,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&local_48,(shared_ptr *)&local_58);
  local_88[0] = bVar3 ^ 1;
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_88,"libcellml::Units::compatible(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75b,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&local_58,(shared_ptr *)&local_48);
  local_88[0] = bVar3 ^ 1;
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_88,"libcellml::Units::compatible(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75c,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, isCompatibleBaseUnitImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u->setImportSource(import);

    EXPECT_TRUE(u->isImport());
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}